

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O3

PrimeCandidateSource * pcs_new_with_firstbits(uint bits,uint first,uint nfirst)

{
  PrimeCandidateSource *pPVar1;
  mp_int *pmVar2;
  mp_int *x;
  
  pPVar1 = (PrimeCandidateSource *)safemalloc(1,0x58,0);
  if (first >> ((char)nfirst - 1U & 0x1f) == 1) {
    pPVar1->bits = bits;
    pPVar1->ready = false;
    pPVar1->try_sophie_germain = false;
    pPVar1->one_shot = false;
    pPVar1->thrown_away_my_shot = false;
    pPVar1->avoids = (avoid *)0x0;
    pPVar1->navoids = 0;
    pPVar1->avoidsize = 0;
    pPVar1->kps = (mp_int **)0x0;
    pPVar1->nkps = 0;
    pPVar1->kpsize = 0;
    pmVar2 = mp_from_integer((ulong)first);
    x = mp_lshift_fixed(pmVar2,(ulong)(bits - nfirst));
    mp_free(pmVar2);
    mp_set_bit(x,0,1);
    pmVar2 = mp_from_integer(2);
    pPVar1->factor = pmVar2;
    pPVar1->addend = x;
    pmVar2 = mp_power_2((ulong)((bits - nfirst) - 1));
    pPVar1->limit = pmVar2;
    pPVar1->avoid_residue = 1;
    pPVar1->avoid_modulus = 0;
    return pPVar1;
  }
  __assert_fail("first >> (nfirst-1) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                ,0x2f,
                "PrimeCandidateSource *pcs_new_with_firstbits(unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

PrimeCandidateSource *pcs_new_with_firstbits(unsigned bits,
                                             unsigned first, unsigned nfirst)
{
    PrimeCandidateSource *s = snew(PrimeCandidateSource);

    assert(first >> (nfirst-1) == 1);

    s->bits = bits;
    s->ready = false;
    s->try_sophie_germain = false;
    s->one_shot = false;
    s->thrown_away_my_shot = false;

    s->kps = NULL;
    s->nkps = s->kpsize = 0;

    s->avoids = NULL;
    s->navoids = s->avoidsize = 0;

    /* Make the number that's the lower limit of our range */
    mp_int *firstmp = mp_from_integer(first);
    mp_int *base = mp_lshift_fixed(firstmp, bits - nfirst);
    mp_free(firstmp);

    /* Set the low bit of that, because all (nontrivial) primes are odd */
    mp_set_bit(base, 0, 1);

    /* That's our addend. Now initialise factor to 2, to ensure we
     * only generate odd numbers */
    s->factor = mp_from_integer(2);
    s->addend = base;

    /* And that means the limit of our random numbers must be one
     * factor of two _less_ than the position of the low bit of
     * 'first', because we'll be multiplying the random number by
     * 2 immediately afterwards. */
    s->limit = mp_power_2(bits - nfirst - 1);

    /* avoid_modulus == 0 signals that there's no extra residue to avoid */
    s->avoid_residue = 1;
    s->avoid_modulus = 0;

    return s;
}